

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O1

void helper_sve_fcadd_h_aarch64(void *vd,void *vn,void *vm,void *vg,void *vs,uint32_t desc)

{
  ushort uVar1;
  ulong uVar2;
  float16 fVar3;
  float16 fVar4;
  ushort uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)((desc & 0x1f) * 8 + 8);
  do {
    uVar2 = *(ulong *)((long)vg + ((long)(uVar6 - 1) >> 6) * 8);
    uVar7 = uVar6;
    do {
      uVar6 = uVar7 - 4;
      fVar4 = *(float16 *)((long)vn + (uVar7 - 2));
      uVar1 = *(ushort *)((long)vm + (uVar7 - 4));
      uVar5 = (ushort)((desc & 0x400) << 5);
      if ((uVar2 >> ((uint)uVar6 & 0x3f) & 1) != 0) {
        fVar3 = float16_add_aarch64(*(float16 *)((long)vn + (uVar7 - 4)),
                                    *(ushort *)((long)vm + (uVar7 - 2)) ^ uVar5 ^ 0x8000,
                                    (float_status *)vs);
        *(float16 *)((long)vd + (uVar7 - 4)) = fVar3;
      }
      if ((uVar2 >> (uVar7 - 2 & 0x3f) & 1) != 0) {
        fVar4 = float16_add_aarch64(fVar4,uVar1 ^ uVar5,(float_status *)vs);
        *(float16 *)((long)vd + (uVar7 - 2)) = fVar4;
      }
      uVar7 = uVar6;
    } while ((uVar6 & 0x3f) != 0);
  } while (uVar6 != 0);
  return;
}

Assistant:

void HELPER(sve_fcadd_h)(void *vd, void *vn, void *vm, void *vg,
                         void *vs, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    uint64_t *g = vg;
    float16 neg_imag = float16_set_sign(0, simd_data(desc));
    float16 neg_real = float16_chs(neg_imag);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float16 e0, e1, e2, e3;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float16);
            i -= 2 * sizeof(float16);

            e0 = *(float16 *)((char *)vn + H1_2(i));
            e1 = *(float16 *)((char *)vm + H1_2(j)) ^ neg_real;
            e2 = *(float16 *)((char *)vn + H1_2(j));
            e3 = *(float16 *)((char *)vm + H1_2(i)) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                *(float16 *)((char *)vd + H1_2(i)) = float16_add(e0, e1, vs);
            }
            if (likely((pg >> (j & 63)) & 1)) {
                *(float16 *)((char *)vd + H1_2(j)) = float16_add(e2, e3, vs);
            }
        } while (i & 63);
    } while (i != 0);
}